

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMemMMReglistImm4Lsl2(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  int32_t iVar1;
  DecodeStatus DVar2;
  uint in_ESI;
  MCInst *in_RDI;
  MCInst *unaff_retaddr;
  int Offset;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_fffffffffffffffc;
  
  iVar1 = SignExtend32(in_ESI & 0xf,4);
  DVar2 = DecodeRegListOperand16
                    (unaff_retaddr,in_stack_fffffffffffffffc,(uint64_t)in_RDI,
                     (MCRegisterInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (DVar2 == MCDisassembler_Fail) {
    DVar2 = MCDisassembler_Fail;
  }
  else {
    MCOperand_CreateReg0(in_RDI,0x14);
    MCOperand_CreateImm0(in_RDI,(long)(iVar1 << 2));
    DVar2 = MCDisassembler_Success;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeMemMMReglistImm4Lsl2(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xf, 4);

	if (DecodeRegListOperand16(Inst, Insn, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	MCOperand_CreateReg0(Inst, Mips_SP);
	MCOperand_CreateImm0(Inst, Offset * 4);

	return MCDisassembler_Success;
}